

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_implicit_global_from_local(REF_NODE ref_node)

{
  int iVar1;
  REF_MPI ref_mpi;
  REF_GLOB *pRVar2;
  uint uVar3;
  void *array;
  REF_GLOB *vector;
  long lVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  REF_GLOB nnode;
  long local_30;
  
  ref_mpi = ref_node->ref_mpi;
  uVar3 = ref_node_synchronize_globals(ref_node);
  if (uVar3 == 0) {
    local_30 = 0;
    if (0 < (long)ref_node->max) {
      lVar6 = 0;
      lVar8 = 0;
      do {
        if ((-1 < ref_node->global[lVar6]) && (ref_node->ref_mpi->id == ref_node->part[lVar6])) {
          lVar8 = lVar8 + 1;
          local_30 = lVar8;
        }
        lVar6 = lVar6 + 1;
      } while (ref_node->max != lVar6);
    }
    if ((long)ref_mpi->n < 0) {
      pcVar9 = "malloc everyones_nnode of REF_GLOB negative";
      uVar5 = 0x311;
LAB_001beeda:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar5,
             "ref_node_implicit_global_from_local",pcVar9);
      return 1;
    }
    array = malloc((long)ref_mpi->n << 3);
    if (array == (void *)0x0) {
      pcVar9 = "malloc everyones_nnode of REF_GLOB NULL";
      uVar5 = 0x311;
LAB_001bef0c:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar5,
             "ref_node_implicit_global_from_local",pcVar9);
      return 2;
    }
    uVar3 = ref_mpi_allgather(ref_mpi,&local_30,array,2);
    if (uVar3 == 0) {
      if ((long)ref_mpi->id < 1) {
        lVar6 = 0;
      }
      else {
        lVar8 = 0;
        lVar6 = 0;
        do {
          lVar6 = lVar6 + *(long *)((long)array + lVar8 * 8);
          lVar8 = lVar8 + 1;
        } while (ref_mpi->id != lVar8);
      }
      free(array);
      iVar1 = ref_node->max;
      lVar8 = (long)iVar1;
      if (lVar8 < 0) {
        pcVar9 = "malloc global of REF_GLOB negative";
        uVar5 = 0x31a;
        goto LAB_001beeda;
      }
      vector = (REF_GLOB *)malloc(lVar8 * 8);
      if (vector == (REF_GLOB *)0x0) {
        pcVar9 = "malloc global of REF_GLOB NULL";
        uVar5 = 0x31a;
        goto LAB_001bef0c;
      }
      local_30 = 0;
      if (iVar1 != 0) {
        pRVar2 = ref_node->global;
        lVar4 = 0;
        lVar7 = 0;
        do {
          if ((-1 < pRVar2[lVar4]) && (ref_node->ref_mpi->id == ref_node->part[lVar4])) {
            vector[lVar4] = lVar7 + lVar6;
            lVar7 = lVar7 + 1;
            local_30 = lVar7;
          }
          lVar4 = lVar4 + 1;
        } while (lVar8 != lVar4);
      }
      uVar3 = ref_node_ghost_glob(ref_node,vector,1);
      if (uVar3 == 0) {
        iVar1 = ref_node->max;
        if (0 < (long)iVar1) {
          pRVar2 = ref_node->global;
          lVar6 = 0;
          do {
            if (-1 < pRVar2[lVar6]) {
              pRVar2[lVar6] = vector[lVar6];
            }
            lVar6 = lVar6 + 1;
          } while (iVar1 != lVar6);
        }
        free(vector);
        uVar3 = ref_node_rebuild_sorted_global(ref_node);
        if (uVar3 == 0) {
          return 0;
        }
        pcVar9 = "rebuild globals";
        uVar5 = 0x32c;
      }
      else {
        pcVar9 = "ghost int";
        uVar5 = 0x324;
      }
    }
    else {
      pcVar9 = "allgather";
      uVar5 = 0x313;
    }
  }
  else {
    pcVar9 = "sync";
    uVar5 = 0x308;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar5,
         "ref_node_implicit_global_from_local",(ulong)uVar3,pcVar9);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_node_implicit_global_from_local(REF_NODE ref_node) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT node, proc;
  REF_GLOB nnode, *global;
  REF_GLOB *everyones_nnode, offset;

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      nnode++;
    }
  }

  ref_malloc(everyones_nnode, ref_mpi_n(ref_mpi), REF_GLOB);
  RSS(ref_mpi_allgather(ref_mpi, &nnode, everyones_nnode, REF_GLOB_TYPE),
      "allgather");

  offset = 0;
  for (proc = 0; proc < ref_mpi_rank(ref_mpi); proc++)
    offset += everyones_nnode[proc];

  ref_free(everyones_nnode);
  ref_malloc(global, ref_node_max(ref_node), REF_GLOB);

  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      global[node] = offset + nnode;
      nnode++;
    }
  }

  RSS(ref_node_ghost_glob(ref_node, global, 1), "ghost int");

  each_ref_node_valid_node(ref_node, node) {
    ref_node->global[node] = global[node];
  }

  ref_free(global);

  RSS(ref_node_rebuild_sorted_global(ref_node), "rebuild globals");

  return REF_SUCCESS;
}